

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O2

void aom_img_upshift(aom_image_t *dst,aom_image_t *src,int input_shift)

{
  aom_img_fmt_t aVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uchar *puVar8;
  uchar *puVar9;
  ushort uVar10;
  byte bVar11;
  long lVar12;
  uint uVar13;
  int offset;
  long lVar14;
  uint uVar15;
  uint uVar16;
  
  aVar1 = src->fmt;
  bVar11 = (byte)input_shift;
  uVar10 = ~(ushort)(-1 << (bVar11 - 1 & 0x1f));
  if (input_shift < 1) {
    uVar10 = 0;
  }
  uVar2 = dst->d_w;
  if ((aVar1 >> 0xb & 1) == 0) {
    if (((((uVar2 == src->d_w) && (uVar3 = dst->d_h, uVar3 == src->d_h)) &&
         (uVar4 = dst->x_chroma_shift, uVar4 == src->x_chroma_shift)) &&
        (((uVar5 = dst->y_chroma_shift, uVar5 == src->y_chroma_shift && (-1 < input_shift)) &&
         (dst->fmt == (aVar1 | 0x800))))) &&
       (((aVar1 - AOM_IMG_FMT_I420 < 5 && ((0x19U >> (aVar1 - AOM_IMG_FMT_I420 & 0x1f) & 1) != 0))
        || (aVar1 == AOM_IMG_FMT_YV12)))) {
      for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
        uVar13 = uVar5 + uVar3 >> ((byte)uVar5 & 0x1f);
        uVar15 = uVar4 + uVar2 >> ((byte)uVar4 & 0x1f);
        if (lVar12 == 0) {
          uVar13 = uVar3;
          uVar15 = uVar2;
        }
        uVar16 = 0;
        if ((int)uVar15 < 1) {
          uVar15 = 0;
        }
        if ((int)uVar13 < 1) {
          uVar13 = uVar16;
        }
        for (; uVar16 != uVar13; uVar16 = uVar16 + 1) {
          iVar6 = src->stride[lVar12];
          puVar8 = src->planes[lVar12];
          iVar7 = dst->stride[lVar12];
          puVar9 = dst->planes[lVar12];
          for (lVar14 = 0; uVar15 != (uint)lVar14; lVar14 = lVar14 + 1) {
            *(ushort *)(puVar9 + lVar14 * 2 + (long)(int)(iVar7 * uVar16)) =
                 ((ushort)puVar8[lVar14 + (int)(iVar6 * uVar16)] << (bVar11 & 0x1f)) + uVar10;
          }
        }
      }
      return;
    }
  }
  else if (((((uVar2 == src->d_w) && (uVar3 = dst->d_h, uVar3 == src->d_h)) &&
            (uVar4 = dst->x_chroma_shift, uVar4 == src->x_chroma_shift)) &&
           ((uVar5 = dst->y_chroma_shift, uVar5 == src->y_chroma_shift && (-1 < input_shift)))) &&
          ((dst->fmt == aVar1 &&
           ((aVar1 - AOM_IMG_FMT_I42016 < 5 &&
            ((0x19U >> (aVar1 - AOM_IMG_FMT_I42016 & 0x1f) & 1) != 0)))))) {
    for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
      uVar13 = uVar5 + uVar3 >> ((byte)uVar5 & 0x1f);
      uVar15 = uVar4 + uVar2 >> ((byte)uVar4 & 0x1f);
      if (lVar12 == 0) {
        uVar13 = uVar3;
        uVar15 = uVar2;
      }
      uVar16 = 0;
      if ((int)uVar15 < 1) {
        uVar15 = 0;
      }
      if ((int)uVar13 < 1) {
        uVar13 = uVar16;
      }
      for (; uVar16 != uVar13; uVar16 = uVar16 + 1) {
        iVar6 = src->stride[lVar12];
        puVar8 = src->planes[lVar12];
        iVar7 = dst->stride[lVar12];
        puVar9 = dst->planes[lVar12];
        for (lVar14 = 0; uVar15 != (uint)lVar14; lVar14 = lVar14 + 1) {
          *(ushort *)(puVar9 + lVar14 * 2 + (long)(int)(iVar7 * uVar16)) =
               (*(short *)(puVar8 + lVar14 * 2 + (long)(int)(iVar6 * uVar16)) << (bVar11 & 0x1f)) +
               uVar10;
        }
      }
    }
    return;
  }
  fatal("Unsupported image conversion");
}

Assistant:

void aom_img_upshift(aom_image_t *dst, const aom_image_t *src,
                     int input_shift) {
  if (src->fmt & AOM_IMG_FMT_HIGHBITDEPTH) {
    highbd_img_upshift(dst, src, input_shift);
  } else {
    lowbd_img_upshift(dst, src, input_shift);
  }
}